

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.cpp
# Opt level: O0

int __thiscall ncnn::Cast::forward(Cast *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  unsigned_short uVar8;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar9;
  float fVar10;
  int i_4;
  float *outptr_4;
  unsigned_short *ptr_4;
  int q_4;
  int i_3;
  unsigned_short *outptr_3;
  float *ptr_3;
  int q_3;
  int i_2;
  float *outptr_2;
  char *ptr_2;
  int q_2;
  int i_1;
  float *outptr_1;
  unsigned_short *ptr_1;
  int q_1;
  int i;
  unsigned_short *outptr;
  float *ptr;
  int q;
  int size;
  size_t out_elemsize;
  int elempack;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  Mat *m_8;
  Mat *m_6;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_9;
  Mat *m_7;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  anon_union_4_2_947300b0 tmp;
  anon_union_4_2_947300b0 tmp_1;
  size_t in_stack_fffffffffffff268;
  Allocator *in_stack_fffffffffffff270;
  int _d;
  size_t in_stack_fffffffffffff278;
  int _w;
  Mat *in_stack_fffffffffffff280;
  undefined8 in_stack_fffffffffffff288;
  int _w_00;
  Mat *in_stack_fffffffffffff290;
  int in_stack_fffffffffffff2e0;
  Allocator *in_stack_fffffffffffff2e8;
  Allocator *in_stack_fffffffffffff2f0;
  int local_bdc;
  int local_b38;
  int local_b34;
  int local_a90;
  int local_a8c;
  int local_9e8;
  int local_9e4;
  undefined8 local_9e0;
  undefined8 local_9d8;
  undefined8 local_9d0;
  undefined4 local_9c8;
  long local_9c0;
  undefined4 local_9b8;
  undefined4 local_9b4;
  undefined4 local_9b0;
  undefined4 local_9ac;
  undefined4 local_9a8;
  undefined8 local_9a0;
  long local_998;
  undefined8 local_990;
  undefined8 local_988;
  undefined8 local_980;
  undefined4 local_978;
  long local_970;
  undefined4 local_968;
  undefined4 local_964;
  undefined4 local_960;
  undefined4 local_95c;
  undefined4 local_958;
  undefined8 local_950;
  long local_948;
  int local_940;
  int local_93c;
  undefined8 local_938;
  undefined8 local_930;
  undefined8 local_928;
  undefined4 local_920;
  long local_918;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  undefined4 local_904;
  undefined4 local_900;
  undefined8 local_8f8;
  long local_8f0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined8 local_8c8;
  undefined4 local_8c0;
  long local_8b8;
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined4 local_8a8;
  undefined4 local_8a4;
  undefined4 local_8a0;
  undefined8 local_898;
  long local_890;
  int local_888;
  int local_884;
  long local_880;
  int local_874;
  long local_870;
  int local_864;
  int local_860;
  int local_85c;
  int local_858;
  int local_854;
  long *local_848;
  long *local_840;
  int local_82c;
  int local_828;
  undefined4 local_824;
  long *local_820;
  long *local_808;
  undefined1 local_7b5;
  int local_7b4;
  undefined8 *local_7a8;
  undefined1 local_79d;
  int local_79c;
  undefined8 *local_790;
  undefined8 *local_780;
  undefined8 *local_750;
  undefined8 *local_740;
  undefined8 *local_730;
  undefined8 *local_720;
  undefined1 local_64d;
  int local_64c;
  undefined8 *local_640;
  undefined1 local_62d;
  int local_62c;
  undefined8 *local_620;
  undefined8 *local_608;
  undefined8 *local_5f8;
  undefined8 *local_5e0;
  undefined8 *local_498;
  undefined8 *local_478;
  undefined8 *local_458;
  undefined8 *local_438;
  int local_3e0;
  undefined4 local_3dc;
  void *local_3d0;
  long *local_2d8;
  long local_2d0;
  undefined4 local_2c4;
  long local_2c0;
  long local_2b8;
  undefined4 local_2ac;
  int local_2a8;
  int local_2a4;
  undefined8 *local_2a0;
  long local_298;
  undefined4 local_28c;
  long local_288;
  long local_280;
  undefined4 local_274;
  int local_270;
  int local_26c;
  undefined8 *local_268;
  long local_1b8;
  undefined4 local_1ac;
  long local_1a8;
  long local_1a0;
  undefined4 local_194;
  int local_190;
  int local_18c;
  undefined8 *local_188;
  long local_180;
  undefined4 local_174;
  long local_170;
  long local_168;
  undefined4 local_15c;
  int local_158;
  int local_154;
  undefined8 *local_150;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  if (*(int *)(in_RDI + 0xd0) == *(int *)(in_RDI + 0xd4)) {
    if (in_RDX != in_RSI) {
      if (in_RSI[1] != 0) {
        piVar1 = (int *)in_RSI[1];
        local_824 = 1;
        LOCK();
        local_828 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_820 = in_RSI;
      if (in_RDX[1] != 0) {
        piVar1 = (int *)in_RDX[1];
        local_3dc = 0xffffffff;
        LOCK();
        local_3e0 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (local_3e0 == 1) {
          if (in_RDX[4] == 0) {
            local_3d0 = (void *)*in_RDX;
            if (local_3d0 != (void *)0x0) {
              free(local_3d0);
            }
          }
          else {
            (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
          }
        }
      }
      *in_RDX = 0;
      in_RDX[2] = 0;
      *(undefined4 *)(in_RDX + 3) = 0;
      *(undefined4 *)(in_RDX + 5) = 0;
      *(undefined4 *)((long)in_RDX + 0x2c) = 0;
      *(undefined4 *)(in_RDX + 6) = 0;
      *(undefined4 *)((long)in_RDX + 0x34) = 0;
      *(undefined4 *)(in_RDX + 7) = 0;
      in_RDX[8] = 0;
      in_RDX[1] = 0;
      *in_RDX = *local_820;
      in_RDX[1] = local_820[1];
      in_RDX[2] = local_820[2];
      *(int *)(in_RDX + 3) = (int)local_820[3];
      in_RDX[4] = local_820[4];
      *(int *)(in_RDX + 5) = (int)local_820[5];
      *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)local_820 + 0x2c);
      *(int *)(in_RDX + 6) = (int)local_820[6];
      *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)local_820 + 0x34);
      *(int *)(in_RDX + 7) = (int)local_820[7];
      in_RDX[8] = local_820[8];
    }
    local_82c = 0;
  }
  else {
    local_854 = *(int *)((long)in_RSI + 0x2c);
    local_858 = (int)in_RSI[6];
    local_85c = *(int *)((long)in_RSI + 0x34);
    local_860 = (int)in_RSI[7];
    local_864 = (int)in_RSI[5];
    local_870 = in_RSI[2];
    local_874 = (int)in_RSI[3];
    if (*(int *)(in_RDI + 0xd4) == 1) {
      local_880 = (long)(local_874 << 2);
    }
    else if (*(int *)(in_RDI + 0xd4) == 2) {
      local_880 = (long)(local_874 << 1);
    }
    else if (*(int *)(in_RDI + 0xd4) == 3) {
      local_880 = (long)local_874;
    }
    else {
      local_880 = local_870;
      if (*(int *)(in_RDI + 0xd4) == 4) {
        local_880 = (long)(local_874 << 1);
      }
    }
    _w = (int)(in_stack_fffffffffffff278 >> 0x20);
    _w_00 = (int)((ulong)in_stack_fffffffffffff288 >> 0x20);
    local_848 = in_RDX;
    local_840 = in_RSI;
    if (local_864 == 1) {
      Mat::create(in_stack_fffffffffffff290,_w_00,(size_t)in_stack_fffffffffffff280,_w,
                  in_stack_fffffffffffff270);
    }
    else if (local_864 == 2) {
      Mat::create(in_stack_fffffffffffff290,_w_00,(int)in_stack_fffffffffffff288,
                  (size_t)in_stack_fffffffffffff280,_w,in_stack_fffffffffffff270);
    }
    else {
      _d = (int)((ulong)in_stack_fffffffffffff270 >> 0x20);
      if (local_864 == 3) {
        Mat::create(in_stack_fffffffffffff290,_w_00,(int)in_stack_fffffffffffff288,
                    (int)((ulong)in_stack_fffffffffffff280 >> 0x20),in_stack_fffffffffffff278,_d,
                    in_stack_fffffffffffff2f0);
      }
      else if (local_864 == 4) {
        Mat::create(in_stack_fffffffffffff280,_w,(int)in_stack_fffffffffffff278,_d,
                    (int)in_stack_fffffffffffff270,in_stack_fffffffffffff268,
                    in_stack_fffffffffffff2e0,in_stack_fffffffffffff2e8);
      }
    }
    local_808 = local_848;
    bVar9 = true;
    if (*local_848 != 0) {
      local_2d8 = local_848;
      bVar9 = local_848[8] * (long)(int)local_848[7] == 0;
    }
    if (bVar9) {
      local_82c = -100;
    }
    else {
      local_884 = local_854 * local_858 * local_85c * local_874;
      if ((*(int *)(in_RDI + 0xd0) == 1) && (*(int *)(in_RDI + 0xd4) == 2)) {
        for (local_888 = 0; local_888 < local_860; local_888 = local_888 + 1) {
          local_790 = &local_8d8;
          local_18c = *(int *)((long)local_840 + 0x2c);
          local_190 = (int)local_840[6];
          local_194 = *(undefined4 *)((long)local_840 + 0x34);
          local_890 = *local_840 + local_840[8] * (long)local_888 * local_840[2];
          local_1a8 = local_840[2];
          local_1ac = (undefined4)local_840[3];
          local_1b8 = local_840[4];
          local_188 = &local_8d8;
          local_58 = (long)local_18c * (long)local_190 * local_1a8;
          local_780 = &local_8d8;
          local_750 = &local_8d8;
          local_620 = &local_938;
          local_2a4 = *(int *)((long)local_848 + 0x2c);
          local_2a8 = (int)local_848[6];
          local_2ac = *(undefined4 *)((long)local_848 + 0x34);
          local_8f0 = *local_848 + local_848[8] * (long)local_888 * local_848[2];
          local_2c0 = local_848[2];
          local_2c4 = (undefined4)local_848[3];
          local_2d0 = local_848[4];
          local_2a0 = &local_938;
          local_8 = (long)local_2a4 * (long)local_2a8 * local_2c0;
          local_608 = &local_938;
          local_740 = &local_938;
          local_8a0 = 0;
          local_8a4 = 0;
          local_8a8 = 0;
          local_8ac = 0;
          local_8c0 = 0;
          local_8c8 = 0;
          local_8d0 = 0;
          local_8d8 = 0;
          local_c = 0x10;
          local_5c = 0x10;
          local_62c = local_888;
          local_62d = 1;
          local_79c = local_888;
          local_79d = 1;
          local_898 = 0;
          local_8b0 = 0;
          local_938 = 0;
          local_928 = 0;
          local_920 = 0;
          local_910 = 0;
          local_90c = 0;
          local_908 = 0;
          local_904 = 0;
          local_900 = 0;
          local_8f8 = 0;
          local_930 = 0;
          local_458 = local_740;
          local_438 = local_750;
          local_2b8 = local_8f0;
          local_1a0 = local_890;
          local_918 = local_2d0;
          local_8b8 = local_1b8;
          for (local_93c = 0; local_93c < local_884; local_93c = local_93c + 1) {
            uVar8 = float32_to_float16(*(float *)(local_890 + (long)local_93c * 4));
            *(unsigned_short *)(local_8f0 + (long)local_93c * 2) = uVar8;
          }
        }
      }
      if ((*(int *)(in_RDI + 0xd0) == 2) && (*(int *)(in_RDI + 0xd4) == 1)) {
        for (local_940 = 0; local_940 < local_860; local_940 = local_940 + 1) {
          local_7a8 = &local_990;
          local_154 = *(int *)((long)local_840 + 0x2c);
          local_158 = (int)local_840[6];
          local_15c = *(undefined4 *)((long)local_840 + 0x34);
          local_948 = *local_840 + local_840[8] * (long)local_940 * local_840[2];
          local_170 = local_840[2];
          local_174 = (undefined4)local_840[3];
          local_180 = local_840[4];
          local_150 = &local_990;
          local_68 = (long)local_154 * (long)local_158 * local_170;
          local_5f8 = &local_990;
          local_730 = &local_990;
          local_640 = &local_9e0;
          local_26c = *(int *)((long)local_848 + 0x2c);
          local_270 = (int)local_848[6];
          local_274 = *(undefined4 *)((long)local_848 + 0x34);
          local_998 = *local_848 + local_848[8] * (long)local_940 * local_848[2];
          local_288 = local_848[2];
          local_28c = (undefined4)local_848[3];
          local_298 = local_848[4];
          local_268 = &local_9e0;
          local_18 = (long)local_26c * (long)local_270 * local_288;
          local_5e0 = &local_9e0;
          local_720 = &local_9e0;
          local_958 = 0;
          local_95c = 0;
          local_960 = 0;
          local_964 = 0;
          local_978 = 0;
          local_980 = 0;
          local_988 = 0;
          local_990 = 0;
          local_1c = 0x10;
          local_6c = 0x10;
          local_64c = local_940;
          local_64d = 1;
          local_7b4 = local_940;
          local_7b5 = 1;
          local_950 = 0;
          local_968 = 0;
          local_9e0 = 0;
          local_9d0 = 0;
          local_9c8 = 0;
          local_9b8 = 0;
          local_9b4 = 0;
          local_9b0 = 0;
          local_9ac = 0;
          local_9a8 = 0;
          local_9a0 = 0;
          local_9d8 = 0;
          local_498 = local_720;
          local_478 = local_730;
          local_280 = local_998;
          local_168 = local_948;
          local_9c0 = local_298;
          local_970 = local_180;
          for (local_9e4 = 0; local_9e4 < local_884; local_9e4 = local_9e4 + 1) {
            fVar10 = float16_to_float32(*(unsigned_short *)(local_948 + (long)local_9e4 * 2));
            *(float *)(local_998 + (long)local_9e4 * 4) = fVar10;
          }
        }
      }
      if ((*(int *)(in_RDI + 0xd0) == 3) && (*(int *)(in_RDI + 0xd4) == 1)) {
        for (local_9e8 = 0; local_9e8 < local_860; local_9e8 = local_9e8 + 1) {
          lVar2 = *local_840;
          lVar3 = local_840[8];
          lVar4 = local_840[2];
          lVar5 = *local_848;
          lVar6 = local_848[8];
          lVar7 = local_848[2];
          for (local_a8c = 0; local_a8c < local_884; local_a8c = local_a8c + 1) {
            *(float *)(lVar5 + lVar6 * local_9e8 * lVar7 + (long)local_a8c * 4) =
                 (float)(int)*(char *)(lVar2 + lVar3 * local_9e8 * lVar4 + (long)local_a8c);
          }
        }
      }
      if ((*(int *)(in_RDI + 0xd0) == 1) && (*(int *)(in_RDI + 0xd4) == 4)) {
        for (local_a90 = 0; local_a90 < local_860; local_a90 = local_a90 + 1) {
          lVar2 = *local_840;
          lVar3 = local_840[8];
          lVar4 = local_840[2];
          lVar5 = *local_848;
          lVar6 = local_848[8];
          lVar7 = local_848[2];
          for (local_b34 = 0; local_b34 < local_884; local_b34 = local_b34 + 1) {
            *(short *)(lVar5 + lVar6 * local_a90 * lVar7 + (long)local_b34 * 2) =
                 (short)((uint)*(undefined4 *)
                                (lVar2 + lVar3 * local_a90 * lVar4 + (long)local_b34 * 4) >> 0x10);
          }
        }
      }
      if ((*(int *)(in_RDI + 0xd0) == 4) && (*(int *)(in_RDI + 0xd4) == 1)) {
        for (local_b38 = 0; local_b38 < local_860; local_b38 = local_b38 + 1) {
          lVar2 = *local_840;
          lVar3 = local_840[8];
          lVar4 = local_840[2];
          lVar5 = *local_848;
          lVar6 = local_848[8];
          lVar7 = local_848[2];
          for (local_bdc = 0; local_bdc < local_884; local_bdc = local_bdc + 1) {
            *(uint *)(lVar5 + lVar6 * local_b38 * lVar7 + (long)local_bdc * 4) =
                 (uint)*(ushort *)(lVar2 + lVar3 * local_b38 * lVar4 + (long)local_bdc * 2) << 0x10;
          }
        }
      }
      local_82c = 0;
    }
  }
  return local_82c;
}

Assistant:

int Cast::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        // float32
        out_elemsize = 4 * elempack;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * elempack;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = elempack;
    }
    else if (type_to == 4)
    {
        // bfloat16
        out_elemsize = 2 * elempack;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    else if (dims == 4)
    {
        top_blob.create(w, h, d, channels, out_elemsize, elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * d * elempack;

    if (type_from == 1 && type_to == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = float32_to_float16(ptr[i]);
            }
        }
    }

    if (type_from == 2 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = float16_to_float32(ptr[i]);
            }
        }
    }

    if (type_from == 3 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const signed char* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = (float)ptr[i];
            }
        }
    }

    if (type_from == 1 && type_to == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = float32_to_bfloat16(ptr[i]);
            }
        }
    }

    if (type_from == 4 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                outptr[i] = bfloat16_to_float32(ptr[i]);
            }
        }
    }

    // TODO more cast type

    return 0;
}